

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O0

void __thiscall CompoundFile::File::File(File *this,istream *stream,string *fileName)

{
  undefined8 in_RSI;
  void *in_RDI;
  string *in_stack_00000268;
  File *in_stack_00000270;
  Header *in_stack_ffffffffffffffb0;
  
  std::ifstream::ifstream(in_RDI);
  *(undefined8 *)((long)in_RDI + 0x208) = in_RSI;
  Header::Header(in_stack_ffffffffffffffb0);
  SAT::SAT((SAT *)0x12f65f);
  SAT::SAT((SAT *)0x12f677);
  SecID::SecID((SecID *)((long)in_RDI + 0x268));
  std::
  map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
  ::map((map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
         *)0x12f6a2);
  initialize(in_stack_00000270,in_stack_00000268);
  return;
}

Assistant:

inline
File::File( std::istream & stream, const std::string & fileName )
	:	m_stream( stream )
{
	initialize( fileName );
}